

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t
psa_key_agreement_raw_internal
          (psa_algorithm_t alg,psa_key_slot_t *private_key,uint8_t *peer_key,size_t peer_key_length,
          uint8_t *shared_secret,size_t shared_secret_size,size_t *shared_secret_length)

{
  mbedtls_ecp_keypair *key;
  mbedtls_ecp_keypair *key_00;
  psa_ecc_curve_t curve;
  psa_status_t pVar1;
  int iVar2;
  psa_status_t pVar3;
  mbedtls_ecp_keypair *their_key;
  mbedtls_ecdh_context ecdh;
  size_t local_2a8;
  mbedtls_ecp_keypair *local_2a0;
  mbedtls_ecdh_context local_298;
  
  if (alg != 0x30200000) {
    return -0x86;
  }
  if (*(char *)((long)&(private_key->attr).type + 1) != 'q') {
    return -0x87;
  }
  key = (private_key->data).ecp;
  local_2a0 = (mbedtls_ecp_keypair *)0x0;
  local_2a8 = 0;
  curve = mbedtls_ecc_group_to_psa((key->grp).id,&local_2a8);
  mbedtls_ecdh_init(&local_298);
  pVar1 = psa_import_ec_public_key(curve,peer_key,peer_key_length,&local_2a0);
  key_00 = local_2a0;
  if (pVar1 == 0) {
    iVar2 = mbedtls_ecdh_get_params(&local_298,local_2a0,MBEDTLS_ECDH_THEIRS);
    pVar1 = mbedtls_to_psa_error(iVar2);
    if (pVar1 == 0) {
      iVar2 = mbedtls_ecdh_get_params(&local_298,key,MBEDTLS_ECDH_OURS);
      pVar1 = mbedtls_to_psa_error(iVar2);
      if (pVar1 == 0) {
        iVar2 = mbedtls_ecdh_calc_secret
                          (&local_298,shared_secret_length,shared_secret,shared_secret_size,
                           mbedtls_ctr_drbg_random,&global_data.ctr_drbg);
        pVar1 = mbedtls_to_psa_error(iVar2);
        if (pVar1 == 0) {
          pVar1 = -0x97;
          pVar3 = 0;
          if (local_2a8 + 7 >> 3 == *shared_secret_length) goto LAB_001148e6;
        }
      }
    }
  }
  mbedtls_platform_zeroize(shared_secret,shared_secret_size);
  pVar3 = pVar1;
LAB_001148e6:
  mbedtls_ecdh_free(&local_298);
  mbedtls_ecp_keypair_free(key_00);
  free(key_00);
  return pVar3;
}

Assistant:

static psa_status_t psa_key_agreement_raw_internal( psa_algorithm_t alg,
                                                    psa_key_slot_t *private_key,
                                                    const uint8_t *peer_key,
                                                    size_t peer_key_length,
                                                    uint8_t *shared_secret,
                                                    size_t shared_secret_size,
                                                    size_t *shared_secret_length )
{
    switch( alg )
    {
#if defined(MBEDTLS_ECDH_C)
        case PSA_ALG_ECDH:
            if( ! PSA_KEY_TYPE_IS_ECC_KEY_PAIR( private_key->attr.type ) )
                return( PSA_ERROR_INVALID_ARGUMENT );
            return( psa_key_agreement_ecdh( peer_key, peer_key_length,
                                            private_key->data.ecp,
                                            shared_secret, shared_secret_size,
                                            shared_secret_length ) );
#endif /* MBEDTLS_ECDH_C */
        default:
            (void) private_key;
            (void) peer_key;
            (void) peer_key_length;
            (void) shared_secret;
            (void) shared_secret_size;
            (void) shared_secret_length;
            return( PSA_ERROR_NOT_SUPPORTED );
    }
}